

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_group.cpp
# Opt level: O0

void resize_group_parts(Am_Slot first_invalidated)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  void *this;
  Am_Value *pAVar9;
  int width;
  int height;
  int top;
  int left;
  Am_Object part;
  Am_Value_List parts;
  float height_ratio;
  float width_ratio;
  int new_height;
  int new_width;
  int old_height;
  int old_width;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object self;
  Am_Slot first_invalidated_local;
  
  self.data = (Am_Object_Data *)first_invalidated.data;
  Am_Object::Am_Object(&local_18);
  Am_Slot::Get_Owner((Am_Slot *)&local_20);
  Am_Object::operator=(&local_18,&local_20);
  Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&local_20);
  poVar8 = std::operator<<((ostream *)&std::cout,"resize of ");
  poVar8 = operator<<(poVar8,&local_18);
  this = (void *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  pAVar9 = Am_Object::Get(&local_18,0x7df,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar9);
  pAVar9 = Am_Object::Get(&local_18,0x7e0,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar9);
  pAVar9 = Am_Object::Get(&local_18,0x66,0);
  width_ratio = (float)Am_Value::operator_cast_to_int(pAVar9);
  pAVar9 = Am_Object::Get(&local_18,0x67,0);
  height_ratio = (float)Am_Value::operator_cast_to_int(pAVar9);
  if ((iVar2 != 0) && (iVar3 != 0)) {
    if (width_ratio == 0.0) {
      width_ratio = 1.4013e-45;
    }
    if (height_ratio == 0.0) {
      height_ratio = 1.4013e-45;
    }
    Am_Value_List::Am_Value_List((Am_Value_List *)&part);
    pAVar9 = Am_Object::Get(&local_18,0x82,0);
    Am_Value_List::operator=((Am_Value_List *)&part,pAVar9);
    Am_Object::Am_Object((Am_Object *)&top);
    Am_Value_List::Start((Am_Value_List *)&part);
    while( true ) {
      bVar1 = Am_Value_List::Last((Am_Value_List *)&part);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pAVar9 = Am_Value_List::Get((Am_Value_List *)&part);
      Am_Object::operator=((Am_Object *)&top,pAVar9);
      pAVar9 = Am_Object::Get((Am_Object *)&top,100,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar9);
      pAVar9 = Am_Object::Get((Am_Object *)&top,0x65,0);
      iVar5 = Am_Value::operator_cast_to_int(pAVar9);
      pAVar9 = Am_Object::Get((Am_Object *)&top,0x67,0);
      iVar6 = Am_Value::operator_cast_to_int(pAVar9);
      pAVar9 = Am_Object::Get((Am_Object *)&top,0x66,0);
      iVar7 = Am_Value::operator_cast_to_int(pAVar9);
      Am_Object::Set((Am_Object *)&top,100,
                     (int)((float)iVar4 * ((float)(int)width_ratio / (float)iVar2)),0);
      Am_Object::Set((Am_Object *)&top,0x66,
                     (int)((float)iVar7 * ((float)(int)width_ratio / (float)iVar2)),0);
      Am_Object::Set((Am_Object *)&top,0x65,
                     (int)((float)iVar5 * ((float)(int)height_ratio / (float)iVar3)),0);
      Am_Object::Set((Am_Object *)&top,0x67,
                     (int)((float)iVar6 * ((float)(int)height_ratio / (float)iVar3)),0);
      Am_Value_List::Next((Am_Value_List *)&part);
    }
    Am_Object::~Am_Object((Am_Object *)&top);
    Am_Value_List::~Am_Value_List((Am_Value_List *)&part);
  }
  Am_Object::Set(&local_18,0x7e0,(int)height_ratio,0);
  Am_Object::Set(&local_18,0x7df,(int)width_ratio,0);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

static void
resize_group_parts(Am_Slot first_invalidated)
{
  Am_Object self;
  self = first_invalidated.Get_Owner();
  std::cout << "resize of " << self << std::endl << std::flush;
  int old_width, old_height, new_width, new_height;
  float width_ratio, height_ratio;
  old_width = self.Get(Am_OLD_WIDTH);
  old_height = self.Get(Am_OLD_HEIGHT);
  new_width = self.Get(Am_WIDTH);
  new_height = self.Get(Am_HEIGHT);
  if (old_width && old_height) { //otherwise, first time changed
    if (new_width == 0)
      new_width = 1;
    if (new_height == 0)
      new_height = 1;
    width_ratio = (float)new_width / (float)old_width;
    height_ratio = (float)new_height / (float)old_height;
    Am_Value_List parts;
    parts = self.Get(Am_GRAPHICAL_PARTS);
    Am_Object part;
    for (parts.Start(); !parts.Last(); parts.Next()) {
      part = parts.Get();
      int left = (int)part.Get(Am_LEFT);
      int top = (int)part.Get(Am_TOP);
      int height = (int)part.Get(Am_HEIGHT);
      int width = (int)part.Get(Am_WIDTH);
      part.Set(Am_LEFT, (int)(left * width_ratio));
      part.Set(Am_WIDTH, (int)(width * width_ratio));
      part.Set(Am_TOP, (int)(top * height_ratio));
      part.Set(Am_HEIGHT, (int)(height * height_ratio));
    }
  }
  self.Set(Am_OLD_HEIGHT, new_height);
  self.Set(Am_OLD_WIDTH, new_width);
}